

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_base.cpp
# Opt level: O3

void __thiscall QDtlsBasePrivate::clearDtlsError(QDtlsBasePrivate *this)

{
  QArrayData *pQVar1;
  
  this->errorCode = NoError;
  if ((this->errorDescription).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this->errorDescription).d.d)->super_QArrayData;
    (this->errorDescription).d.d = (Data *)0x0;
    (this->errorDescription).d.ptr = (char16_t *)0x0;
    (this->errorDescription).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
        return;
      }
    }
  }
  return;
}

Assistant:

void QDtlsBasePrivate::clearDtlsError()
{
    errorCode = QDtlsError::NoError;
    errorDescription.clear();
}